

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  string_view filename;
  _Alloc_hider _Var1;
  undefined8 uVar2;
  bool bVar3;
  Result RVar4;
  Result RVar5;
  Result RVar6;
  char *pcVar7;
  size_type pos;
  size_t sVar8;
  FileStream *callback;
  uint uVar9;
  Module *this;
  string_view filename_00;
  string_view sVar10;
  string_view y;
  ValidateOptions options_1;
  undefined4 uStack_48c;
  undefined1 local_488 [48];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors errors;
  FileStream h_stream;
  ReadBinaryOptions options;
  string header_name;
  OptionParser parser;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wasm2c",
             "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
            );
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  stack0xfffffffffffffb70 = 0;
  local_488._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:61:72)>
       ::_M_invoke;
  local_488._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:61:72)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&options_1);
  if ((_Manager_type)local_488._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_488._0_8_)(&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  stack0xfffffffffffffb70 = 0;
  local_488._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:68:7)>
       ::_M_invoke;
  local_488._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:68:7)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILENAME",
             "Output file for the generated C source file, by default use stdout",
             (Callback *)&options_1);
  if ((_Manager_type)local_488._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_488._0_8_)(&options_1,&options_1,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  stack0xfffffffffffffb70 = 0;
  local_488._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:74:20)>
       ::_M_invoke;
  local_488._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:74:20)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-debug-names","Ignore debug names in the binary file",
             (NullCallback *)&options_1);
  if ((_Manager_type)local_488._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_488._0_8_)(&options_1,&options_1,3);
  }
  std::__cxx11::string::string((string *)&options_1,"filename",(allocator *)&options);
  callback = &h_stream;
  h_stream.super_Stream._vptr_Stream = (_func_int **)0x0;
  h_stream.super_Stream.offset_ = 0;
  h_stream.super_Stream.log_stream_ =
       (Stream *)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:76:22)>
       ::_M_invoke;
  h_stream.super_Stream._16_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm2c.cc:76:22)>
       ::_M_manager;
  wabt::OptionParser::AddArgument(&parser,(string *)&options_1,One,(Callback *)callback);
  if (h_stream.super_Stream._16_8_ != 0) {
    (*(code *)h_stream.super_Stream._16_8_)(&h_stream,&h_stream,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  if (((((CONCAT26(s_features._8_2_,s_features._2_6_) & 0x101010101010101) == 0) &&
       (s_features.exceptions_enabled_ == false)) &&
      (s_features.annotations_enabled_ == false && s_features.gc_enabled_ == false)) &&
     (s_features.mutable_globals_enabled_ != false)) {
    wabt::OptionParser::~OptionParser(&parser);
    _Var1 = s_infile_abi_cxx11_._M_dataplus;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar7 = (char *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
    sVar10.size_ = (size_type)&file_data;
    sVar10.data_ = pcVar7;
    RVar4 = wabt::ReadFile((wabt *)_Var1._M_p,sVar10,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
    if (RVar4.enum_ == Ok) {
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this = (Module *)&parser;
      wabt::Module::Module(this);
      options.read_debug_names = (bool)(s_read_debug_names ^ 1);
      options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
      options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
      options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
      options.features.simd_enabled_ = s_features.simd_enabled_;
      options.features.threads_enabled_ = s_features.threads_enabled_;
      options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
      options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
      options.features.annotations_enabled_ = s_features.annotations_enabled_;
      options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
      options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
      options.features.gc_enabled_ = s_features.gc_enabled_;
      options.log_stream =
           (Stream *)
           s_log_stream._M_t.
           super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
           super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
           super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
      options.stop_on_first_error = true;
      options.fail_on_custom_section_error = true;
      RVar4 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,
                                 file_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)file_data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)file_data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,&options,&errors,
                                 this);
      uVar2 = stack0xfffffffffffffb70;
      if (RVar4.enum_ == Ok) {
        options_1.features.annotations_enabled_ = s_features.annotations_enabled_;
        options_1.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
        options_1.features.reference_types_enabled_ = s_features.reference_types_enabled_;
        options_1.features.gc_enabled_ = s_features.gc_enabled_;
        uStack_48c = SUB84(uVar2,4);
        options_1.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
        options_1.features.exceptions_enabled_ = s_features.exceptions_enabled_;
        options_1.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
        options_1.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
        options_1.features.simd_enabled_ = s_features.simd_enabled_;
        options_1.features.threads_enabled_ = s_features.threads_enabled_;
        options_1.features.multi_value_enabled_ = s_features.multi_value_enabled_;
        options_1.features.tail_call_enabled_ = s_features.tail_call_enabled_;
        RVar5 = wabt::ValidateModule((Module *)&parser,&errors,&options_1);
        RVar6 = wabt::GenerateNames((Module *)&parser,None);
        RVar4.enum_ = Error;
        if ((RVar5.enum_ != Error) && (RVar6.enum_ != Error)) {
          wabt::ApplyNames((Module *)&parser);
          if (s_outfile_abi_cxx11_._M_string_length == 0) {
            wabt::FileStream::FileStream((FileStream *)&options_1,_stdout,(Stream *)0x0);
            RVar4 = wabt::WriteC((wabt *)&options_1,(Stream *)&options_1,(Stream *)"wasm.h",
                                 (char *)&parser,(Module *)&s_write_c_options,(WriteCOptions *)this)
            ;
            wabt::FileStream::~FileStream((FileStream *)&options_1);
          }
          else {
            h_stream.super_Stream._vptr_Stream = (_func_int **)s_outfile_abi_cxx11_._M_dataplus._M_p
            ;
            h_stream.super_Stream.offset_ = s_outfile_abi_cxx11_._M_string_length;
            pos = wabt::string_view::find_last_of((string_view *)&h_stream,'.',0xffffffffffffffff);
            sVar10 = wabt::string_view::substr((string_view *)&h_stream,pos,0xffffffffffffffff);
            options_1.features._0_8_ = h_stream.super_Stream._vptr_Stream;
            stack0xfffffffffffffb70 = h_stream.super_Stream.offset_;
            y.size_ = 2;
            y.data_ = ".c";
            bVar3 = wabt::operator==(sVar10,y);
            if (bVar3) {
              wabt::string_view::remove_suffix((string_view *)&options_1,sVar10.size_);
            }
            h_stream.super_Stream._vptr_Stream = (_func_int **)options_1.features._0_8_;
            h_stream.super_Stream.offset_ = stack0xfffffffffffffb70;
            wabt::string_view::to_string_abi_cxx11_((string *)&options_1,(string_view *)&h_stream);
            std::operator+(&header_name,(string *)&options_1,".h");
            std::__cxx11::string::_M_dispose();
            _Var1 = s_outfile_abi_cxx11_._M_dataplus;
            sVar8 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
            filename_00.size_ = sVar8;
            filename_00.data_ = _Var1._M_p;
            wabt::FileStream::FileStream((FileStream *)&options_1,filename_00,(Stream *)0x0);
            filename.size_ = header_name._M_string_length;
            filename.data_ = header_name._M_dataplus._M_p;
            wabt::FileStream::FileStream(&h_stream,filename,(Stream *)0x0);
            RVar4 = wabt::WriteC((wabt *)&options_1,&h_stream.super_Stream,
                                 (Stream *)header_name._M_dataplus._M_p,(char *)&parser,
                                 (Module *)&s_write_c_options,(WriteCOptions *)this);
            wabt::FileStream::~FileStream(&h_stream);
            wabt::FileStream::~FileStream((FileStream *)&options_1);
            std::__cxx11::string::_M_dispose();
          }
        }
      }
      options_1.features._0_8_ = local_488;
      stack0xfffffffffffffb70 = 0;
      local_488._0_8_ = local_488._0_8_ & 0xffffffffffffff00;
      wabt::FormatErrorsToFile
                (&errors,Binary,(LexerSourceLineFinder *)0x0,(FILE *)_stderr,(string *)&options_1,
                 Never,0x50);
      std::__cxx11::string::_M_dispose();
      wabt::Module::~Module((Module *)&parser);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
      uVar9 = (uint)(RVar4.enum_ != Ok);
    }
    else {
      uVar9 = 1;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return uVar9;
  }
  fwrite("wasm2c currently support only default feature flags.\n",0x35,1,_stderr);
  exit(1);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    const bool kFailOnCustomSectionError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              kFailOnCustomSectionError);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
        result |= GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        if (!s_outfile.empty()) {
          std::string header_name =
              strip_extension(s_outfile).to_string() + ".h";
          FileStream c_stream(s_outfile.c_str());
          FileStream h_stream(header_name);
          result = WriteC(&c_stream, &h_stream, header_name.c_str(), &module,
                          s_write_c_options);
        } else {
          FileStream stream(stdout);
          result =
              WriteC(&stream, &stream, "wasm.h", &module, s_write_c_options);
        }
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}